

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseFloatHexaLiteralTest_Test::TestBody
          (OpenDDLParserTest_parseFloatHexaLiteralTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  float value;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  char *in;
  Value *data;
  char *end;
  char token1 [11];
  size_t len;
  OpenDDLParserTest_parseFloatHexaLiteralTest_Test *this_local;
  
  stack0xffffffffffffffe8 = 0;
  end._0_7_ = 0x30303846337830;
  stack0xffffffffffffffdf = 0x303030;
  data = (Value *)findEnd((char *)&end,(size_t *)(token1 + 8));
  in = (char *)0x0;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::parseHexaLiteral((char *)&end,(char *)data,(Value **)&in);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_50,
             gtest_ar_.message_.ptr_ !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&value,(internal *)local_50,(AssertionResult *)"nullptr == in","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x22a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&value);
    testing::Message::~Message(local_68);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    gtest_ar.message_.ptr_._0_4_ = Value::getFloat((Value *)in);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_a8,"1.0f","value",1.0,gtest_ar.message_.ptr_._0_4_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x22c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,(Value *)in);
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseFloatHexaLiteralTest) {
    size_t len(0);
    char token1[] = "0x3F800000", *end(findEnd(token1, len));
    Value *data(nullptr);
    char *in = OpenDDLParser::parseHexaLiteral(token1, end, &data);
    ASSERT_FALSE(nullptr == in);
    const float value(data->getFloat());
    EXPECT_FLOAT_EQ(1.0f, value);
    registerValueForDeletion(data);
}